

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_2::anon_unknown_0::readTile<Imf_3_2::TiledInputFile>
               (TiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Header *pHVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  int x;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int y;
  int iVar14;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  allocator_type local_68 [56];
  
  Imf_3_2::TiledInputFile::header();
  piVar5 = (int *)Imf_3_2::Header::dataWindow();
  iVar12 = piVar5[2];
  iVar13 = *piVar5;
  iVar1 = Imf_3_2::TiledInputFile::numXLevels();
  iVar2 = Imf_3_2::TiledInputFile::numYLevels();
  Imf_3_2::TiledInputFile::header();
  piVar5 = (int *)Imf_3_2::Header::tileDescription();
  pHVar6 = (Header *)Imf_3_2::TiledInputFile::header();
  lVar7 = Imf_3_2::calculateBytesPerPixel(pHVar6);
  __n = ((long)iVar12 - (long)iVar13) + 1;
  if ((!reduceMemory) ||
     ((lVar7 * __n < 0x7a1201 && (lVar7 * (ulong)(uint)(piVar5[1] * *piVar5) < 0xf4241)))) {
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
              (&halfChannels,__n,local_68);
    std::vector<float,_std::allocator<float>_>::vector
              (&floatChannels,__n,(allocator_type *)local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&uintChannels,__n,(allocator_type *)local_68);
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var8 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    uVar11 = 0;
    while( true ) {
      p_Var9 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var8 == p_Var9) break;
      if (uVar11 % 3 == 2) {
LAB_00113bd3:
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,UINT,
                   (char *)(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                           -(iVar13 / *(int *)&p_Var8[9].field_0x4)),4,0,
                   *(int *)&p_Var8[9].field_0x4,*(int *)&p_Var8[9]._M_parent,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var8 + 1));
      }
      else {
        if (uVar11 % 3 == 1) {
          Imf_3_2::Slice::Slice
                    ((Slice *)local_68,FLOAT,
                     (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                             -(iVar13 / *(int *)&p_Var8[9].field_0x4)),4,0,
                     *(int *)&p_Var8[9].field_0x4,*(int *)&p_Var8[9]._M_parent,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var8 + 1));
          goto LAB_00113bd3;
        }
        Imf_3_2::Slice::Slice
                  ((Slice *)local_68,HALF,
                   (char *)(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                           -(iVar13 / *(int *)&p_Var8[9].field_0x4)),2,0,
                   *(int *)&p_Var8[9].field_0x4,*(int *)&p_Var8[9]._M_parent,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var8 + 1));
      }
      uVar11 = uVar11 + 1;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    }
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)in);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (iVar12 = 0; iVar12 != iVar2; iVar12 = iVar12 + 1) {
      for (iVar13 = 0; iVar13 != iVar1; iVar13 = iVar13 + 1) {
        iVar14 = 0;
        while( true ) {
          iVar10 = (int)in;
          iVar3 = Imf_3_2::TiledInputFile::numYTiles(iVar10);
          if (iVar3 <= iVar14) break;
          for (iVar3 = 0; iVar4 = Imf_3_2::TiledInputFile::numXTiles(iVar10), iVar3 < iVar4;
              iVar3 = iVar3 + 1) {
            Imf_3_2::TiledInputFile::readTile(iVar10,iVar3,iVar14,iVar13);
          }
          iVar14 = iVar14 + 1;
        }
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&floatChannels.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
              (&halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&i);
  }
  return false;
}

Assistant:

bool
readTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx        = dw.min.x;
        int numXLevels = in.numXLevels ();
        int numYLevels = in.numYLevels ();

        const TileDescription& td    = in.header ().tileDescription ();
        uint64_t               bytes = calculateBytesPerPixel (in.header ());

        if (reduceMemory && (w * bytes > gMaxBytesPerScanline ||
                             (td.xSize * td.ySize * bytes) > gMaxTileBytes))
        {
            return false;
        }

        FrameBuffer i;
        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert (
                        c.name (),
                        Slice (
                            HALF,
                            (char*) &halfChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (half),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
                case 1:
                    i.insert (
                        c.name (),
                        Slice (
                            FLOAT,
                            (char*) &floatChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (float),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                case 2:
                    i.insert (
                        c.name (),
                        Slice (
                            UINT,
                            (char*) &uintChannels
                                [-dwx / c.channel ().xSampling],
                            sizeof (unsigned int),
                            0,
                            c.channel ().xSampling,
                            c.channel ().ySampling));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        size_t step = 1;

        size_t tileIndex = 0;
        bool   isRipMap  = td.mode == RIPMAP_LEVELS;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {
                                in.readTile (x, y, xlevel, ylevel);
                            }
                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;

                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}